

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O1

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::~basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)1> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  paVar2 = &(this->file_path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  std::fstream::~fstream(&this->frw_seq_file_);
  (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)&PTR__Executor_001c0678;
  pcVar1 = (this->executor_wrapper_).super_Executor._name._M_dataplus._M_p;
  paVar2 = &(this->executor_wrapper_).super_Executor._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

basic_seq_coro_file(coro_io::ExecutorWrapper<> *executor =
                          coro_io::get_global_block_executor())
      : basic_seq_coro_file(executor->get_asio_executor()) {}